

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uxsel.c
# Opt level: O3

void uxsel_del(int fd)

{
  void *e;
  undefined1 local_c [4];
  
  e = find234(fds,local_c,uxsel_fd_findcmp);
  if (e != (void *)0x0) {
    if (*(uxsel_id **)((long)e + 0x10) != (uxsel_id *)0x0) {
      uxsel_input_remove(*(uxsel_id **)((long)e + 0x10));
    }
    del234(fds,e);
    safefree(e);
  }
  return;
}

Assistant:

void uxsel_del(int fd)
{
    struct fd *oldfd = find234(fds, &fd, uxsel_fd_findcmp);
    if (oldfd) {
        if (oldfd->id)
            uxsel_input_remove(oldfd->id);
        del234(fds, oldfd);
        sfree(oldfd);
    }
}